

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CropLayerParams::Clear(CropLayerParams *this)

{
  BorderAmounts *this_00;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  CropLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->offset_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->cropamounts_ != (BorderAmounts *)0x0)) &&
     (this_00 = this->cropamounts_, this_00 != (BorderAmounts *)0x0)) {
    BorderAmounts::~BorderAmounts(this_00);
    operator_delete(this_00,0x30);
  }
  this->cropamounts_ = (BorderAmounts *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CropLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CropLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  offset_.Clear();
  if (GetArenaForAllocation() == nullptr && cropamounts_ != nullptr) {
    delete cropamounts_;
  }
  cropamounts_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}